

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

tuple pybind11::make_tuple<(pybind11::return_value_policy)1>(void)

{
  PyTypeObject *pPVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  handle *this;
  cast_error *this_00;
  PyObject **ppPVar6;
  object in_RDI;
  handle local_b0;
  iterator local_a8;
  value_type *arg_value;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_0UL> *__range2;
  undefined1 local_7e;
  undefined1 local_7d;
  int counter;
  char local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [39];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>
  local_29;
  ulong uStack_28;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>
  argtypes;
  size_t i;
  undefined8 uStack_18;
  array<pybind11::object,_0UL> args;
  size_t size;
  tuple *result;
  
  uStack_18 = 0;
  i._7_1_ = 0;
  uStack_28 = 0;
  while( true ) {
    uVar2 = uStack_28;
    sVar5 = std::array<pybind11::object,_0UL>::size((array<pybind11::object,_0UL> *)((long)&i + 7));
    if (sVar5 <= uVar2) {
      local_7e = 0;
      tuple::tuple((tuple *)in_RDI.super_handle.m_ptr,0);
      __range2._4_4_ = 0;
      __begin0 = (iterator)((long)&i + 7);
      __end0 = std::array<pybind11::object,_0UL>::begin((array<pybind11::object,_0UL> *)__begin0);
      arg_value = std::array<pybind11::object,_0UL>::end((array<pybind11::object,_0UL> *)__begin0);
      while( true ) {
        if (__end0 == arg_value) {
          return (tuple)in_RDI.super_handle.m_ptr;
        }
        local_a8 = __end0;
        local_b0 = object::release(__end0);
        ppPVar6 = handle::ptr(&local_b0);
        pPVar1 = (PyTypeObject *)*ppPVar6;
        ppPVar6 = handle::ptr((handle *)in_RDI.super_handle.m_ptr);
        iVar4 = PyType_HasFeature((*ppPVar6)->ob_type,0x4000000);
        if (iVar4 == 0) break;
        ppPVar6 = handle::ptr((handle *)in_RDI.super_handle.m_ptr);
        (&(*ppPVar6)[1].ob_type)[__range2._4_4_] = pPVar1;
        __end0 = __end0 + 1;
        __range2._4_4_ = __range2._4_4_ + 1;
      }
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/cast.h"
                    ,0x658,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <>]"
                   );
    }
    this = &std::array<pybind11::object,_0UL>::operator[]
                      ((array<pybind11::object,_0UL> *)((long)&i + 7),uStack_28)->super_handle;
    bVar3 = handle::operator_cast_to_bool(this);
    if (!bVar3) break;
    uStack_28 = uStack_28 + 1;
  }
  local_29 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>
              )0x0;
  local_7d = 1;
  this_00 = (cast_error *)__cxa_allocate_exception(0x10);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>::
  operator[](&local_29,uStack_28);
  std::operator+(local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          "make_tuple(): unable to convert argument of type \'");
  std::operator+(local_50,local_70);
  cast_error::runtime_error(this_00,local_50);
  local_7d = 0;
  __cxa_throw(this_00,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}